

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O1

DateCastResult
duckdb::Date::TryConvertDate
          (char *buf,idx_t len,idx_t *pos,date_t *result,bool *special,bool strict)

{
  char cVar1;
  byte bVar2;
  idx_t iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int year;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  int32_t month;
  int32_t day;
  int32_t local_38;
  int32_t local_34;
  
  *special = false;
  *pos = 0;
  if (len == 0) {
    return ERROR_INCORRECT_FORMAT;
  }
  local_34 = 0;
  local_38 = -1;
  uVar6 = *pos;
  bVar12 = uVar6 < len;
  if (!bVar12) {
    return ERROR_INCORRECT_FORMAT;
  }
  while( true ) {
    uVar5 = uVar6 + 1;
    if ((4 < (byte)buf[uVar6] - 9) && (buf[uVar6] != 0x20)) break;
    *pos = uVar5;
    bVar12 = uVar5 < len;
    uVar6 = uVar5;
    if (uVar5 == len) {
      return ERROR_INCORRECT_FORMAT;
    }
  }
  if (!bVar12) {
    return ERROR_INCORRECT_FORMAT;
  }
  cVar1 = buf[uVar6];
  if ((cVar1 == '-') && (*pos = uVar5, len <= uVar5)) {
    return ERROR_INCORRECT_FORMAT;
  }
  if ((byte)(buf[*pos] - 0x30U) < 10) {
    uVar6 = *pos;
    iVar11 = 0;
    uVar5 = len - uVar6;
    bVar12 = uVar6 <= len && uVar5 != 0;
    if ((uVar6 <= len && uVar5 != 0) && (bVar2 = buf[uVar6], (byte)(bVar2 - 0x30) < 10)) {
      iVar11 = 0;
      uVar9 = 0;
      do {
        if (99999999 < iVar11) {
          return ERROR_RANGE;
        }
        iVar11 = (uint)bVar2 + iVar11 * 10 + -0x30;
        uVar10 = uVar6 + uVar9 + 1;
        *pos = uVar10;
        uVar7 = len;
        if ((uVar6 - len) + 1 + uVar9 == 0) goto LAB_013159da;
        bVar2 = buf[uVar9 + uVar6 + 1];
        uVar9 = uVar9 + 1;
      } while ((byte)(bVar2 - 0x30) < 10);
      uVar7 = uVar6 + uVar9;
      uVar5 = uVar9;
LAB_013159da:
      bVar12 = uVar10 < len;
      bVar13 = uVar5 < 2;
      uVar6 = uVar7;
    }
    else {
      bVar13 = true;
    }
    if ((bVar13 & strict) != 0) {
      return ERROR_INCORRECT_FORMAT;
    }
    year = -iVar11;
    if (cVar1 != '-') {
      year = iVar11;
    }
    if (!bVar12) {
      return ERROR_INCORRECT_FORMAT;
    }
    *pos = uVar6 + 1;
    bVar2 = buf[uVar6];
    uVar4 = bVar2 - 0x20;
    if (0x3c < uVar4) {
      return ERROR_INCORRECT_FORMAT;
    }
    if ((0x100000000000a001U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
      return ERROR_INCORRECT_FORMAT;
    }
    bVar12 = ParseDoubleDigit(buf,len,pos,&local_38);
    if (!bVar12) {
      return ERROR_INCORRECT_FORMAT;
    }
    uVar6 = *pos;
    if (len <= uVar6) {
      return ERROR_INCORRECT_FORMAT;
    }
    *pos = uVar6 + 1;
    if (len <= uVar6 + 1 || buf[uVar6] != bVar2) {
      return ERROR_INCORRECT_FORMAT;
    }
    bVar12 = ParseDoubleDigit(buf,len,pos,&local_34);
    if (!bVar12) {
      return ERROR_INCORRECT_FORMAT;
    }
    iVar3 = *pos;
    if ((4 < len - iVar3) &&
       ((((byte)buf[iVar3] - 9 < 5 || (buf[iVar3] == 0x20)) && (buf[iVar3 + 1] == '(')))) {
      bVar2 = buf[iVar3 + 2];
      bVar8 = bVar2 | 0x20;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        bVar8 = bVar2;
      }
      if (bVar8 == 0x62) {
        bVar2 = buf[iVar3 + 3];
        bVar8 = bVar2 | 0x20;
        if (0x19 < (byte)(bVar2 + 0xbf)) {
          bVar8 = bVar2;
        }
        if ((bVar8 == 99) && (buf[iVar3 + 4] == ')')) {
          if (cVar1 == '-') {
            return ERROR_INCORRECT_FORMAT;
          }
          if (year == 0) {
            return ERROR_INCORRECT_FORMAT;
          }
          year = 1 - year;
          *pos = iVar3 + 5;
        }
      }
    }
    uVar6 = *pos;
    if (strict) {
      if (uVar6 < len) {
        do {
          uVar5 = uVar6 + 1;
          if ((4 < (byte)buf[uVar6] - 9) && (buf[uVar6] != 0x20)) {
            if (uVar6 < len) {
              return ERROR_INCORRECT_FORMAT;
            }
            break;
          }
          *pos = uVar5;
          uVar6 = uVar5;
        } while (uVar5 != len);
      }
    }
    else if ((uVar6 < len) && ((byte)(buf[uVar6] - 0x30U) < 10)) {
      return ERROR_INCORRECT_FORMAT;
    }
    bVar12 = TryFromDate(year,local_38,local_34,result);
    return !bVar12 * '\x02';
  }
  bVar12 = TryConvertDateSpecial(buf,len,pos,PINF);
  if (bVar12) {
    iVar11 = (uint)(cVar1 == '-') * 2 + 0x7fffffff;
  }
  else {
    bVar12 = TryConvertDateSpecial(buf,len,pos,EPOCH);
    iVar11 = 0;
    if (!bVar12) {
      return ERROR_INCORRECT_FORMAT;
    }
  }
  result->days = iVar11;
  uVar6 = *pos;
  uVar5 = uVar6;
  if (uVar6 < len) {
    do {
      if ((4 < (byte)buf[uVar6] - 9) && (uVar5 = uVar6, buf[uVar6] != 0x20)) break;
      uVar6 = uVar6 + 1;
      *pos = uVar6;
      uVar5 = len;
    } while (len != uVar6);
  }
  *special = true;
  return uVar5 != len;
}

Assistant:

DateCastResult Date::TryConvertDate(const char *buf, idx_t len, idx_t &pos, date_t &result, bool &special,
                                    bool strict) {
	special = false;
	pos = 0;
	if (len == 0) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	int32_t day = 0;
	int32_t month = -1;
	int32_t year = 0;
	bool yearneg = false;
	int sep;

	// skip leading spaces
	while (pos < len && StringUtil::CharacterIsSpace(buf[pos])) {
		pos++;
	}

	if (pos >= len) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}
	if (buf[pos] == '-') {
		yearneg = true;
		pos++;
		if (pos >= len) {
			return DateCastResult::ERROR_INCORRECT_FORMAT;
		}
	}
	if (!StringUtil::CharacterIsDigit(buf[pos])) {
		// Check for special values
		if (TryConvertDateSpecial(buf, len, pos, PINF)) {
			result = yearneg ? date_t::ninfinity() : date_t::infinity();
		} else if (TryConvertDateSpecial(buf, len, pos, EPOCH)) {
			result = date_t::epoch();
		} else {
			return DateCastResult::ERROR_INCORRECT_FORMAT;
		}
		// skip trailing spaces - parsing must be strict here
		while (pos < len && StringUtil::CharacterIsSpace(buf[pos])) {
			pos++;
		}
		special = true;
		return (pos == len) ? DateCastResult::SUCCESS : DateCastResult::ERROR_INCORRECT_FORMAT;
	}
	// first parse the year
	idx_t year_length = 0;
	for (; pos < len && StringUtil::CharacterIsDigit(buf[pos]); pos++) {
		if (year >= 100000000) {
			return DateCastResult::ERROR_RANGE;
		}
		year = (buf[pos] - '0') + year * 10;
		year_length++;
	}
	if (year_length < 2 && strict) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}
	if (yearneg) {
		year = -year;
	}

	if (pos >= len) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	// fetch the separator
	sep = buf[pos++];
	if (sep != ' ' && sep != '-' && sep != '/' && sep != '\\') {
		// invalid separator
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	// parse the month
	if (!Date::ParseDoubleDigit(buf, len, pos, month)) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	if (pos >= len) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	if (buf[pos++] != sep) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	if (pos >= len) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	// now parse the day
	if (!Date::ParseDoubleDigit(buf, len, pos, day)) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	// check for an optional trailing " (BC)""
	if (len - pos >= 5 && StringUtil::CharacterIsSpace(buf[pos]) && buf[pos + 1] == '(' &&
	    StringUtil::CharacterToLower(buf[pos + 2]) == 'b' && StringUtil::CharacterToLower(buf[pos + 3]) == 'c' &&
	    buf[pos + 4] == ')') {
		if (yearneg || year == 0) {
			return DateCastResult::ERROR_INCORRECT_FORMAT;
		}
		year = -year + 1;
		pos += 5;
	}

	// in strict mode, check remaining string for non-space characters
	if (strict) {
		// skip trailing spaces
		while (pos < len && StringUtil::CharacterIsSpace(buf[pos])) {
			pos++;
		}
		// check position. if end was not reached, non-space chars remaining
		if (pos < len) {
			return DateCastResult::ERROR_INCORRECT_FORMAT;
		}
	} else {
		// in non-strict mode, check for any direct trailing digits
		if (pos < len && StringUtil::CharacterIsDigit(buf[pos])) {
			return DateCastResult::ERROR_INCORRECT_FORMAT;
		}
	}

	return Date::TryFromDate(year, month, day, result) ? DateCastResult::SUCCESS : DateCastResult::ERROR_RANGE;
}